

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Thing_Raise(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  bool bVar1;
  AActor *thing;
  undefined1 local_48 [8];
  TActorIterator<AActor> iterator;
  bool ok;
  AActor *target;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  iterator.super_FActorIterator._15_1_ = 0;
  if (arg0 == 0) {
    iterator.super_FActorIterator._15_1_ = P_Thing_Raise(it,(AActor *)0x0);
  }
  else {
    TActorIterator<AActor>::TActorIterator((TActorIterator<AActor> *)local_48,arg0);
    while (thing = TActorIterator<AActor>::Next((TActorIterator<AActor> *)local_48),
          thing != (AActor *)0x0) {
      bVar1 = P_Thing_Raise(thing,(AActor *)0x0);
      iterator.super_FActorIterator._15_1_ =
           (iterator.super_FActorIterator._15_1_ & 1) != 0 || bVar1;
    }
  }
  return (int)(iterator.super_FActorIterator._15_1_ & 1);
}

Assistant:

FUNC(LS_Thing_Raise)
// Thing_Raise(tid)
{
	AActor * target;
	bool ok = false;

	if (arg0==0)
	{
		ok = P_Thing_Raise (it,NULL);
	}
	else
	{
		TActorIterator<AActor> iterator (arg0);

		while ( (target = iterator.Next ()) )
		{
			ok |= P_Thing_Raise(target,NULL);
		}
	}
	return ok;
}